

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mojoshader_assembler.c
# Opt level: O0

int parse_args_DSSS(Context_conflict *ctx)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int retval;
  Context_conflict *ctx_local;
  
  iVar1 = parse_destination_token(ctx);
  require_comma(ctx);
  iVar2 = parse_source_token(ctx);
  require_comma(ctx);
  iVar3 = parse_source_token(ctx);
  require_comma(ctx);
  iVar4 = parse_source_token(ctx);
  return iVar4 + iVar3 + iVar2 + iVar1 + 1;
}

Assistant:

static int parse_args_DSSS(Context *ctx)
{
    int retval = 1;
    retval += parse_destination_token(ctx);
    require_comma(ctx);
    retval += parse_source_token(ctx);
    require_comma(ctx);
    retval += parse_source_token(ctx);
    require_comma(ctx);
    retval += parse_source_token(ctx);
    return retval;
}